

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_NODE pRVar3;
  REF_INT RVar4;
  undefined4 uVar5;
  bool bVar6;
  uint uVar7;
  REF_INT RVar8;
  uint uVar9;
  REF_STATUS RVar10;
  void *pvVar11;
  long lVar12;
  REF_INT *pRVar13;
  long lVar14;
  undefined8 uVar15;
  REF_GRID pRVar16;
  REF_NODE pRVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  REF_INT RVar23;
  REF_INT RVar25;
  REF_INT RVar26;
  REF_INT RVar27;
  undefined1 auVar24 [16];
  ulong uVar28;
  REF_CELL ref_cell_split;
  REF_INT e2;
  REF_NODE local_258;
  REF_INT e0;
  undefined4 uStack_24c;
  REF_INT e1;
  undefined4 uStack_244;
  REF_NODE local_240;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  REF_INT e4;
  REF_INT e3;
  REF_CELL local_148;
  REF_INT e5_1;
  REF_INT nmark_1;
  REF_GRID local_138;
  ulong local_130;
  REF_CELL local_128;
  undefined8 uStack_120;
  ulong local_110;
  uint local_108;
  undefined4 uStack_104;
  undefined8 uStack_100;
  REF_DBL local_f8;
  REF_INT e5;
  undefined1 local_e8 [16];
  REF_NODE local_d0;
  undefined1 local_c8 [16];
  REF_INT nmark;
  REF_CELL local_a8;
  undefined8 uStack_a0;
  REF_CELL local_98;
  REF_DBL local_90;
  REF_CELL local_88;
  REF_CELL local_80;
  REF_DBL local_78;
  REF_CELL local_70;
  REF_CELL local_68;
  REF_DBL local_60;
  double local_58;
  undefined8 uStack_50;
  REF_DBL local_48;
  undefined8 uStack_40;
  
  pRVar16 = ref_subdiv->grid;
  pRVar17 = pRVar16->node;
  uVar7 = ref_node_synchronize_globals(pRVar17);
  if (uVar7 != 0) {
    uVar28 = (ulong)uVar7;
    pcVar19 = "sync glob for mark relax";
    uVar15 = 0x861;
    goto LAB_001e3971;
  }
  if (ref_subdiv->instrument != 0) {
    uVar7 = ref_subdiv_mark_n(ref_subdiv,&nmark);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "count";
      uVar15 = 0x864;
      goto LAB_001e3971;
    }
    if (ref_subdiv->grid->mpi->id == 0) {
      printf(" %d edges marked before relaxation\n",(ulong)(uint)nmark);
    }
  }
  if (ref_subdiv->allow_geometry == 0) {
    uVar7 = ref_subdiv_unmark_geom_support(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "all geom marks";
      uVar15 = 0x873;
      goto LAB_001e3971;
    }
    if ((ref_subdiv->new_mark_allowed != 0) &&
       (uVar7 = ref_subdiv_mark_relax(ref_subdiv), uVar7 != 0)) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "relax marks";
      uVar15 = 0x875;
      goto LAB_001e3971;
    }
    uVar7 = ref_subdiv_unmark_geom_support(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "all geom marks";
      uVar15 = 0x877;
      goto LAB_001e3971;
    }
    uVar7 = ref_subdiv_unmark_relax(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "relax marks";
      uVar15 = 0x878;
      goto LAB_001e3971;
    }
    uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "possible";
      uVar15 = 0x879;
      goto LAB_001e3971;
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "new nodes";
      uVar15 = 0x87a;
      goto LAB_001e3971;
    }
  }
  else {
    if (ref_subdiv->new_mark_allowed != 0) {
      uVar7 = ref_subdiv_mark_relax(ref_subdiv);
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "relax marks";
        uVar15 = 0x86b;
        goto LAB_001e3971;
      }
      uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "possible";
        uVar15 = 0x86c;
        goto LAB_001e3971;
      }
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "new nodes";
      uVar15 = 0x86e;
      goto LAB_001e3971;
    }
    e5_1 = 1;
    local_110 = 0;
    local_138 = pRVar16;
    local_d0 = pRVar17;
    while (e5_1 != 0) {
      e5_1 = 0;
      uVar7 = ref_subdiv_unmark_relax(ref_subdiv);
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "unmark relax inside neg tet";
        uVar15 = 0x334;
        goto LAB_001e4cea;
      }
      local_130 = CONCAT44(local_130._4_4_,(int)local_110 + 1);
      local_258 = ref_subdiv->grid->node;
      pRVar1 = ref_subdiv->grid->cell[8];
      for (iVar20 = 0; iVar20 < pRVar1->max; iVar20 = iVar20 + 1) {
        if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] != -1) {
          RVar8 = ref_subdiv_map(ref_subdiv,pRVar1,iVar20);
          uVar7 = ref_cell_nodes(pRVar1,iVar20,nodes);
          if (uVar7 != 0) {
            uVar28 = (ulong)uVar7;
            pcVar19 = "nodes";
            uVar15 = 0x277;
            goto LAB_001e4cbf;
          }
          if (((RVar8 - 1U < 2) || (RVar8 == 4)) || (RVar8 == 8)) {
LAB_001e3c33:
            iVar21 = -1;
            for (iVar22 = 0; iVar22 < pRVar1->edge_per; iVar22 = iVar22 + 1) {
              pRVar13 = ref_subdiv->mark;
              RVar8 = ref_subdiv_c2e(ref_subdiv,pRVar1,iVar22,iVar20);
              if (pRVar13[RVar8] != 0) {
                iVar21 = iVar22;
              }
            }
            if (iVar21 != -1) {
              RVar8 = ref_subdiv_c2e(ref_subdiv,pRVar1,iVar21,iVar20);
              pRVar17 = local_258;
              for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                new_nodes[lVar14] = nodes[lVar14];
              }
              local_240 = (REF_NODE)(long)RVar8;
              new_nodes[pRVar1->e2n[iVar21 * 2]] = ref_subdiv->node[(long)local_240];
              uVar7 = ref_node_tet_vol(local_258,new_nodes,(REF_DBL *)&ref_cell_split);
              pRVar3 = local_258;
              if (uVar7 != 0) {
                uVar28 = (ulong)uVar7;
                uVar15 = 0x28c;
                goto LAB_001e4a32;
              }
              local_148 = (REF_CELL)pRVar17->min_volume;
              local_128 = ref_cell_split;
              for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                new_nodes[lVar14] = nodes[lVar14];
              }
              new_nodes[pRVar1->e2n[(int)(iVar21 * 2 | 1)]] = ref_subdiv->node[(long)local_240];
              uVar7 = ref_node_tet_vol(local_258,new_nodes,(REF_DBL *)&ref_cell_split);
              if (uVar7 == 0) {
                bVar6 = (double)local_128 < (double)local_148;
                if (pRVar3->min_volume <= (double)ref_cell_split) {
LAB_001e4535:
                  if (!bVar6) goto LAB_001e456e;
                }
LAB_001e4539:
                e5_1 = 1;
                for (iVar21 = 0; iVar21 < pRVar1->edge_per; iVar21 = iVar21 + 1) {
                  pRVar13 = ref_subdiv->mark;
                  RVar8 = ref_subdiv_c2e(ref_subdiv,pRVar1,iVar21,iVar20);
                  pRVar13[RVar8] = 0;
                }
                goto LAB_001e456e;
              }
              uVar28 = (ulong)uVar7;
              pcVar19 = "split vol";
              uVar15 = 0x292;
              goto LAB_001e4cbf;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x286,"ref_subdiv_unmark_neg_tet_geom_support","edge not found");
            uVar28 = 1;
          }
          else {
            if (RVar8 != 0xb) {
              if (RVar8 == 0x10) goto LAB_001e3c33;
              RVar27 = nodes[2];
              RVar4 = nodes[3];
              RVar23 = nodes[1];
              RVar25 = nodes[0];
              RVar26 = nodes[1];
              if (RVar8 != 0x15) {
                if (RVar8 == 0x3f) {
                  local_240 = (REF_NODE)CONCAT44(local_240._4_4_,nodes[0]);
                  local_c8._0_4_ = nodes[1];
                  uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],&e0);
                  if (uVar7 == 0) {
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],&e1);
                    if (uVar7 == 0) {
                      uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[3],&e2);
                      if (uVar7 == 0) {
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],&e3);
                        if (uVar7 == 0) {
                          uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[3],&e4);
                          if (uVar7 == 0) {
                            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[3],&e5);
                            RVar8 = e0;
                            if (uVar7 == 0) {
                              local_108 = RVar27;
                              local_f8 = (REF_DBL)CONCAT44(local_f8._4_4_,RVar4);
                              new_nodes[0] = e0;
                              local_a8 = (REF_CELL)CONCAT44(local_a8._4_4_,e2);
                              new_nodes[1] = e2;
                              local_148 = (REF_CELL)CONCAT44(local_148._4_4_,e1);
                              new_nodes[2] = e1;
                              new_nodes[3] = (REF_INT)local_240;
                              uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                       (REF_DBL *)&ref_cell_split);
                              RVar27 = e3;
                              if (uVar7 == 0) {
                                local_60 = local_258->min_volume;
                                local_68 = ref_cell_split;
                                local_128 = (REF_CELL)CONCAT44(local_128._4_4_,RVar8);
                                new_nodes[0] = RVar8;
                                new_nodes[1] = e3;
                                local_e8._0_4_ = e4;
                                new_nodes[2] = e4;
                                new_nodes[3] = local_c8._0_4_;
                                uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                         (REF_DBL *)&ref_cell_split);
                                if (uVar7 == 0) {
                                  local_c8._0_8_ = local_258->min_volume;
                                  local_70 = ref_cell_split;
                                  new_nodes[0] = (REF_INT)local_148;
                                  local_240 = (REF_NODE)CONCAT44(local_240._4_4_,e5);
                                  new_nodes[1] = e5;
                                  new_nodes[2] = RVar27;
                                  new_nodes[3] = local_108;
                                  uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                           (REF_DBL *)&ref_cell_split);
                                  if (uVar7 == 0) {
                                    local_78 = local_258->min_volume;
                                    local_80 = ref_cell_split;
                                    RVar8 = (REF_INT)local_a8;
                                    new_nodes[0] = (REF_INT)local_a8;
                                    new_nodes[1] = local_e8._0_4_;
                                    new_nodes[2] = (REF_INT)local_240;
                                    new_nodes[3] = local_f8._0_4_;
                                    uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                             (REF_DBL *)&ref_cell_split);
                                    if (uVar7 == 0) {
                                      local_108 = RVar27;
                                      local_f8 = local_258->min_volume;
                                      local_88 = ref_cell_split;
                                      RVar27 = (REF_INT)local_128;
                                      new_nodes[0] = (REF_INT)local_128;
                                      new_nodes[1] = (REF_INT)local_240;
                                      new_nodes[2] = (REF_INT)local_148;
                                      new_nodes[3] = RVar8;
                                      uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                               (REF_DBL *)&ref_cell_split);
                                      if (uVar7 == 0) {
                                        local_90 = local_258->min_volume;
                                        local_98 = ref_cell_split;
                                        new_nodes[0] = RVar27;
                                        new_nodes[1] = (REF_INT)local_240;
                                        new_nodes[2] = RVar8;
                                        uVar5 = local_e8._0_4_;
                                        new_nodes[3] = local_e8._0_4_;
                                        uVar9 = ref_node_tet_vol(local_258,new_nodes,
                                                                 (REF_DBL *)&ref_cell_split);
                                        uVar7 = local_108;
                                        if (uVar9 == 0) {
                                          local_48 = local_258->min_volume;
                                          uStack_40 = 0;
                                          local_a8 = ref_cell_split;
                                          uStack_a0 = 0;
                                          new_nodes[0] = (REF_INT)local_128;
                                          new_nodes[1] = (REF_INT)local_240;
                                          new_nodes[2] = uVar5;
                                          new_nodes[3] = local_108;
                                          uVar9 = ref_node_tet_vol(local_258,new_nodes,
                                                                   (REF_DBL *)&ref_cell_split);
                                          if (uVar9 == 0) {
                                            local_58 = local_258->min_volume;
                                            uStack_50 = 0;
                                            local_e8._8_8_ = 0;
                                            local_e8._0_8_ = ref_cell_split;
                                            new_nodes[0] = (REF_INT)local_128;
                                            new_nodes[1] = (REF_INT)local_240;
                                            new_nodes[2] = uVar7;
                                            new_nodes[3] = (REF_INT)local_148;
                                            uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                                     (REF_DBL *)&ref_cell_split);
                                            if (uVar7 == 0) {
                                              if (local_258->min_volume <= (double)ref_cell_split) {
                                                bVar6 = ((double)local_70 < (double)local_c8._0_8_
                                                        || (double)local_68 < local_60) ||
                                                        ((((double)local_98 < local_90 ||
                                                          (double)local_88 < local_f8) ||
                                                         (double)local_80 < local_78) ||
                                                        ((double)local_e8._0_8_ < local_58 ||
                                                        (double)local_a8 < local_48));
                                                goto LAB_001e4535;
                                              }
                                              goto LAB_001e4539;
                                            }
                                            uVar28 = (ulong)uVar7;
                                            pcVar19 = "split vol";
                                            uVar15 = 0x318;
                                          }
                                          else {
                                            uVar28 = (ulong)uVar9;
                                            pcVar19 = "split vol";
                                            uVar15 = 0x311;
                                          }
                                        }
                                        else {
                                          uVar28 = (ulong)uVar9;
                                          pcVar19 = "split vol";
                                          uVar15 = 0x30a;
                                        }
                                      }
                                      else {
                                        uVar28 = (ulong)uVar7;
                                        pcVar19 = "split vol";
                                        uVar15 = 0x303;
                                      }
                                    }
                                    else {
                                      uVar28 = (ulong)uVar7;
                                      pcVar19 = "split vol";
                                      uVar15 = 0x2fc;
                                    }
                                  }
                                  else {
                                    uVar28 = (ulong)uVar7;
                                    pcVar19 = "split vol";
                                    uVar15 = 0x2f5;
                                  }
                                }
                                else {
                                  uVar28 = (ulong)uVar7;
                                  pcVar19 = "split vol";
                                  uVar15 = 0x2ee;
                                }
                              }
                              else {
                                uVar28 = (ulong)uVar7;
                                pcVar19 = "split vol";
                                uVar15 = 0x2e7;
                              }
                            }
                            else {
                              uVar28 = (ulong)uVar7;
                              pcVar19 = "e";
                              uVar15 = 0x2e2;
                            }
                          }
                          else {
                            uVar28 = (ulong)uVar7;
                            pcVar19 = "e";
                            uVar15 = 0x2e1;
                          }
                        }
                        else {
                          uVar28 = (ulong)uVar7;
                          pcVar19 = "e";
                          uVar15 = 0x2e0;
                        }
                      }
                      else {
                        uVar28 = (ulong)uVar7;
                        pcVar19 = "e";
                        uVar15 = 0x2df;
                      }
                    }
                    else {
                      uVar28 = (ulong)uVar7;
                      pcVar19 = "e";
                      uVar15 = 0x2de;
                    }
                  }
                  else {
                    uVar28 = (ulong)uVar7;
                    pcVar19 = "e";
                    uVar15 = 0x2dd;
                  }
                  goto LAB_001e4cbf;
                }
                RVar23 = nodes[2];
                RVar25 = nodes[1];
                RVar26 = nodes[0];
                RVar27 = nodes[1];
                if ((RVar8 != 0x26) &&
                   (RVar23 = nodes[1], RVar25 = nodes[2], RVar26 = nodes[1], RVar27 = nodes[0],
                   RVar8 != 0x38)) {
                  if (RVar8 != 0x20) goto LAB_001e456e;
                  goto LAB_001e3c33;
                }
              }
              nodes[1] = RVar25;
              nodes[0] = RVar23;
              nodes[2] = RVar26;
              nodes[3] = RVar27;
            }
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              new_nodes[lVar14] = nodes[lVar14];
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
            if (uVar7 == 0) {
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
              pRVar17 = local_258;
              if (uVar7 == 0) {
                uVar7 = ref_node_tet_vol(local_258,new_nodes,(REF_DBL *)&ref_cell_split);
                if (uVar7 != 0) {
                  uVar28 = (ulong)uVar7;
                  uVar15 = 0x2b0;
LAB_001e4a32:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,uVar15,"ref_subdiv_unmark_neg_tet_geom_support",uVar28,"split vol");
                  goto LAB_001e4cc9;
                }
                local_240 = (REF_NODE)pRVar17->min_volume;
                local_148 = ref_cell_split;
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  new_nodes[lVar14] = nodes[lVar14];
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[0],new_nodes);
                if (uVar7 == 0) {
                  uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                  pRVar17 = local_258;
                  if (uVar7 == 0) {
                    uVar7 = ref_node_tet_vol(local_258,new_nodes,(REF_DBL *)&ref_cell_split);
                    if (uVar7 != 0) {
                      uVar28 = (ulong)uVar7;
                      uVar15 = 699;
                      goto LAB_001e4a32;
                    }
                    local_e8._8_8_ = 0;
                    local_e8._0_8_ = pRVar17->min_volume;
                    local_128 = ref_cell_split;
                    uStack_120 = 0;
                    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                      new_nodes[lVar14] = nodes[lVar14];
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes);
                    if (uVar7 == 0) {
                      uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[1],new_nodes + 1);
                      pRVar17 = local_258;
                      if (uVar7 == 0) {
                        uVar7 = ref_node_tet_vol(local_258,new_nodes,(REF_DBL *)&ref_cell_split);
                        if (uVar7 != 0) {
                          uVar28 = (ulong)uVar7;
                          uVar15 = 0x2c6;
                          goto LAB_001e4a32;
                        }
                        local_108 = SUB84(pRVar17->min_volume,0);
                        uStack_104 = (undefined4)((ulong)pRVar17->min_volume >> 0x20);
                        uStack_100 = 0;
                        local_c8._8_8_ = 0;
                        local_c8._0_8_ = ref_cell_split;
                        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                          new_nodes[lVar14] = nodes[lVar14];
                        }
                        bVar6 = (double)local_148 < (double)local_240;
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
                        if (uVar7 == 0) {
                          uVar7 = ref_subdiv_node_between
                                            (ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                          if (uVar7 == 0) {
                            uVar7 = ref_subdiv_node_between
                                              (ref_subdiv,nodes[2],nodes[0],new_nodes + 2);
                            pRVar17 = local_258;
                            if (uVar7 == 0) {
                              uVar7 = ref_node_tet_vol(local_258,new_nodes,
                                                       (REF_DBL *)&ref_cell_split);
                              if (uVar7 == 0) {
                                if (pRVar17->min_volume <= (double)ref_cell_split) {
                                  bVar6 = ((double)local_c8._0_8_ <
                                           (double)CONCAT44(uStack_104,local_108) ||
                                          (double)local_128 < (double)local_e8._0_8_) || bVar6;
                                  goto LAB_001e4535;
                                }
                                goto LAB_001e4539;
                              }
                              uVar28 = (ulong)uVar7;
                              uVar15 = 0x2d4;
                              goto LAB_001e4a32;
                            }
                            uVar28 = (ulong)uVar7;
                            pcVar19 = "mis";
                            uVar15 = 0x2d3;
                          }
                          else {
                            uVar28 = (ulong)uVar7;
                            pcVar19 = "mis";
                            uVar15 = 0x2d0;
                          }
                        }
                        else {
                          uVar28 = (ulong)uVar7;
                          pcVar19 = "mis";
                          uVar15 = 0x2cd;
                        }
                      }
                      else {
                        uVar28 = (ulong)uVar7;
                        pcVar19 = "mis";
                        uVar15 = 0x2c5;
                      }
                    }
                    else {
                      uVar28 = (ulong)uVar7;
                      pcVar19 = "mis";
                      uVar15 = 0x2c2;
                    }
                  }
                  else {
                    uVar28 = (ulong)uVar7;
                    pcVar19 = "mis";
                    uVar15 = 0x2ba;
                  }
                }
                else {
                  uVar28 = (ulong)uVar7;
                  pcVar19 = "mis";
                  uVar15 = 0x2b7;
                }
              }
              else {
                uVar28 = (ulong)uVar7;
                pcVar19 = "mis";
                uVar15 = 0x2af;
              }
            }
            else {
              uVar28 = (ulong)uVar7;
              pcVar19 = "mis";
              uVar15 = 0x2ac;
            }
LAB_001e4cbf:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,uVar15,"ref_subdiv_unmark_neg_tet_geom_support",uVar28,pcVar19);
          }
LAB_001e4cc9:
          pcVar19 = "neg geom";
          uVar15 = 0x337;
          goto LAB_001e4cea;
        }
LAB_001e456e:
      }
      uVar7 = ref_edge_ghost_min_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
      pRVar17 = local_d0;
      pRVar16 = local_138;
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "ghost mark";
        uVar15 = 0x33c;
        goto LAB_001e4cea;
      }
      if (4 < (uint)local_110) {
        uVar7 = ref_subdiv_mark_n(ref_subdiv,&nmark_1);
        if (uVar7 != 0) {
          uVar28 = (ulong)uVar7;
          pcVar19 = "count";
          uVar15 = 0x33f;
          goto LAB_001e4cea;
        }
        if (ref_subdiv->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark neg geom tet relaxations\n",(ulong)(uint)nmark_1,
                 local_130 & 0xffffffff);
        }
        if ((int)local_130 == 200) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x345,"ref_subdiv_unmark_neg_tet_relax",
                 "too many unmark neg geom tet sweeps, stop inf loop");
          uVar28 = 1;
          goto LAB_001e4cf4;
        }
      }
      uVar7 = ref_mpi_all_or(ref_subdiv->grid->mpi,&e5_1);
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "mpi all or";
        uVar15 = 0x347;
        goto LAB_001e4cea;
      }
      local_110 = local_130 & 0xffffffff;
    }
    uVar7 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "ghost mark";
      uVar15 = 0x34d;
LAB_001e4cea:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar15,"ref_subdiv_unmark_neg_tet_relax",uVar28,pcVar19);
LAB_001e4cf4:
      pcVar19 = "geom neg marks";
      uVar15 = 0x86f;
      goto LAB_001e3971;
    }
    if (ref_subdiv->instrument != 0) {
      uVar7 = ref_subdiv_mark_n(ref_subdiv,&nmark_1);
      if (uVar7 != 0) {
        uVar28 = (ulong)uVar7;
        pcVar19 = "count";
        uVar15 = 0x350;
        goto LAB_001e4cea;
      }
      if (ref_subdiv->grid->mpi->id == 0) {
        printf(" %d edges marked after %d neg geom tet unmark relaxations\n",(ulong)(uint)nmark_1,
               local_110);
      }
    }
    uVar7 = ref_subdiv_test_impossible_marks(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "possible";
      uVar15 = 0x870;
      goto LAB_001e3971;
    }
    uVar7 = ref_subdiv_new_node(ref_subdiv);
    if (uVar7 != 0) {
      uVar28 = (ulong)uVar7;
      pcVar19 = "new nodes";
      uVar15 = 0x871;
      goto LAB_001e3971;
    }
  }
  pRVar1 = ref_subdiv->grid->cell[8];
  lVar14 = (long)pRVar1->max;
  if (lVar14 < 0) {
    pcVar19 = "malloc marked_for_removal of REF_INT negative";
    uVar15 = 0x670;
LAB_001e4f0b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar15
           ,"ref_subdiv_split_tet",pcVar19);
    uVar28 = 1;
  }
  else {
    local_240 = ref_subdiv->grid->node;
    local_d0 = pRVar17;
    pvVar11 = malloc(lVar14 * 4);
    if (pvVar11 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x670,"ref_subdiv_split_tet","malloc marked_for_removal of REF_INT NULL");
      uVar28 = 2;
    }
    else {
      for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
        *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
      }
      uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
      if (uVar7 == 0) {
        pRVar17 = (REF_NODE)0x0;
        local_138 = pRVar16;
        while( true ) {
          uVar28 = (ulong)pRVar1->max;
          iVar20 = (int)pRVar17;
          if ((long)uVar28 <= (long)pRVar17) break;
          if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] != -1) {
            uVar7 = ref_subdiv_map(ref_subdiv,pRVar1,iVar20);
            uVar9 = ref_cell_nodes(pRVar1,iVar20,nodes);
            if (uVar9 != 0) {
              uVar28 = (ulong)uVar9;
              pcVar19 = "nodes";
              uVar15 = 0x675;
              goto LAB_001e4ede;
            }
            if (0x3f < uVar7) {
LAB_001e5b6e:
              if (uVar7 == 0) goto LAB_001e5dc4;
              ref_subdiv_map_to_edge(uVar7);
              printf("tet %d, map %d\n",(ulong)pRVar17 & 0xffffffff,(ulong)uVar7);
              pcVar19 = "map not implemented yet";
              uVar28 = 6;
              uVar15 = 0x6fb;
              goto LAB_001e4ede;
            }
            uVar28 = (ulong)uVar7;
            local_258 = pRVar17;
            if ((0x100010116U >> (uVar28 & 0x3f) & 1) != 0) {
              iVar20 = -1;
              for (iVar21 = 0; pRVar17 = local_258, iVar21 < pRVar1->edge_per; iVar21 = iVar21 + 1)
              {
                pRVar13 = ref_subdiv->mark;
                RVar8 = ref_subdiv_c2e(ref_subdiv,pRVar1,iVar21,(REF_INT)local_258);
                if (pRVar13[RVar8] != 0) {
                  iVar20 = iVar21;
                }
              }
              if (iVar20 != -1) {
                RVar8 = ref_subdiv_c2e(ref_subdiv,pRVar1,iVar20,(REF_INT)local_258);
                *(undefined4 *)((long)pvVar11 + (long)pRVar17 * 4) = 1;
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  new_nodes[lVar14] = nodes[lVar14];
                }
                new_nodes[pRVar1->e2n[iVar20 * 2]] = ref_subdiv->node[RVar8];
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                uVar28 = (ulong)uVar7;
                if (uVar7 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    new_nodes[lVar14] = nodes[lVar14];
                  }
                  new_nodes[pRVar1->e2n[(int)(iVar20 * 2 | 1)]] = ref_subdiv->node[RVar8];
                  uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                  pRVar17 = local_258;
                  if (uVar7 == 0) goto LAB_001e5dc4;
                  uVar28 = (ulong)uVar7;
                  pcVar19 = "add";
                  uVar15 = 0x691;
                }
                else {
                  pcVar19 = "add";
                  uVar15 = 0x68c;
                }
                goto LAB_001e4ede;
              }
              pcVar19 = "edge not found";
              uVar15 = 0x684;
              goto LAB_001e4f0b;
            }
            RVar8 = nodes[0];
            RVar27 = nodes[1];
            if ((0x100004000200800U >> (uVar28 & 0x3f) & 1) == 0) {
              if (uVar28 != 0x3f) goto LAB_001e5b6e;
              *(undefined4 *)((long)pvVar11 + (long)pRVar17 * 4) = 1;
              local_108 = nodes[2];
              local_130 = CONCAT44(local_130._4_4_,nodes[3]);
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],&e2);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6e9;
                goto LAB_001e4ede;
              }
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],&e3);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6ea;
                goto LAB_001e4ede;
              }
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[3],&e4);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6eb;
                goto LAB_001e4ede;
              }
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],&e5);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6ec;
                goto LAB_001e4ede;
              }
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[3],&nmark_1);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6ed;
                goto LAB_001e4ede;
              }
              uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[3],&e5_1);
              uVar28 = (ulong)uVar7;
              if (uVar7 != 0) {
                pcVar19 = "e";
                uVar15 = 0x6ee;
                goto LAB_001e4ede;
              }
              local_148 = (REF_CELL)CONCAT44(local_148._4_4_,e2);
              new_nodes[0] = e2;
              local_128 = (REF_CELL)CONCAT44(local_128._4_4_,e4);
              new_nodes[1] = e4;
              local_110 = CONCAT44(local_110._4_4_,e3);
              new_nodes[2] = e3;
              new_nodes[3] = RVar8;
              uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
              if (uVar7 == 0) {
                uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                pRVar17 = local_240;
                if (uVar7 == 0) {
                  if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                    pRVar13 = local_240->part;
                    local_e8._0_8_ = CONCAT44(0,pRVar13[new_nodes[1]]);
                    local_c8._0_8_ = CONCAT44(0,pRVar13[new_nodes[2]]);
                    printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",local_258,0x3f,
                           (ulong)(uint)local_240->ref_mpi->id,(long)new_nodes[0],
                           (ulong)(uint)pRVar13[new_nodes[0]],(long)new_nodes[1],
                           CONCAT44(0,pRVar13[new_nodes[1]]),(long)new_nodes[2],
                           CONCAT44(0,pRVar13[new_nodes[2]]),(long)new_nodes[3],
                           (ulong)(uint)pRVar13[new_nodes[3]]);
                    ref_node_location(pRVar17,new_nodes[0]);
                    ref_node_location(pRVar17,new_nodes[1]);
                    ref_node_location(pRVar17,new_nodes[2]);
                    ref_node_location(pRVar17,new_nodes[3]);
                  }
                  new_nodes[0] = (REF_INT)local_148;
                  local_c8._0_4_ = e5;
                  new_nodes[1] = e5;
                  local_e8._0_4_ = nmark_1;
                  new_nodes[2] = nmark_1;
                  new_nodes[3] = RVar27;
                  uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                  if (uVar7 == 0) {
                    uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                    pRVar17 = local_240;
                    if (uVar7 == 0) {
                      if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                        pRVar13 = local_240->part;
                        local_f8 = (REF_DBL)(ulong)(uint)pRVar13[new_nodes[2]];
                        printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",local_258,
                               0x3f,(ulong)(uint)local_240->ref_mpi->id,(long)new_nodes[0],
                               (ulong)(uint)pRVar13[new_nodes[0]],(long)new_nodes[1],
                               (ulong)(uint)pRVar13[new_nodes[1]],(long)new_nodes[2],local_f8,
                               (long)new_nodes[3],(ulong)(uint)pRVar13[new_nodes[3]]);
                        ref_node_location(pRVar17,new_nodes[0]);
                        ref_node_location(pRVar17,new_nodes[1]);
                        ref_node_location(pRVar17,new_nodes[2]);
                        ref_node_location(pRVar17,new_nodes[3]);
                      }
                      RVar8 = e5_1;
                      new_nodes[0] = (uint)local_110;
                      new_nodes[1] = e5_1;
                      new_nodes[2] = local_c8._0_4_;
                      new_nodes[3] = local_108;
                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                      if (uVar7 == 0) {
                        uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                        pRVar17 = local_240;
                        if (uVar7 == 0) {
                          if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                            pRVar13 = local_240->part;
                            local_108 = pRVar13[new_nodes[1]];
                            uStack_104 = 0;
                            local_f8 = (REF_DBL)(ulong)(uint)pRVar13[new_nodes[2]];
                            printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                                   local_258,0x3f,(ulong)(uint)local_240->ref_mpi->id,
                                   (long)new_nodes[0],(ulong)(uint)pRVar13[new_nodes[0]],
                                   (long)new_nodes[1],(ulong)local_108,(long)new_nodes[2],local_f8,
                                   (long)new_nodes[3],(ulong)(uint)pRVar13[new_nodes[3]]);
                            ref_node_location(pRVar17,new_nodes[0]);
                            ref_node_location(pRVar17,new_nodes[1]);
                            ref_node_location(pRVar17,new_nodes[2]);
                            ref_node_location(pRVar17,new_nodes[3]);
                          }
                          new_nodes[0] = (REF_INT)local_128;
                          new_nodes[1] = local_e8._0_4_;
                          new_nodes[2] = RVar8;
                          new_nodes[3] = (int)local_130;
                          uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                          if (uVar7 == 0) {
                            uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                            pRVar17 = local_240;
                            if (uVar7 == 0) {
                              if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                                pRVar13 = local_240->part;
                                local_108 = pRVar13[new_nodes[1]];
                                uStack_104 = 0;
                                local_130 = (ulong)(uint)pRVar13[new_nodes[2]];
                                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                                       local_258,0x3f,(ulong)(uint)local_240->ref_mpi->id,
                                       (long)new_nodes[0],(ulong)(uint)pRVar13[new_nodes[0]],
                                       (long)new_nodes[1],(ulong)local_108,(long)new_nodes[2],
                                       local_130,(long)new_nodes[3],
                                       (ulong)(uint)pRVar13[new_nodes[3]]);
                                ref_node_location(pRVar17,new_nodes[0]);
                                ref_node_location(pRVar17,new_nodes[1]);
                                ref_node_location(pRVar17,new_nodes[2]);
                                ref_node_location(pRVar17,new_nodes[3]);
                              }
                              new_nodes[0] = (REF_INT)local_148;
                              new_nodes[1] = RVar8;
                              new_nodes[2] = (uint)local_110;
                              new_nodes[3] = (REF_INT)local_128;
                              uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                              if (uVar7 == 0) {
                                uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                                pRVar17 = local_240;
                                if (uVar7 == 0) {
                                  if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                                    pRVar13 = local_240->part;
                                    local_108 = pRVar13[new_nodes[1]];
                                    uStack_104 = 0;
                                    local_130 = (ulong)(uint)pRVar13[new_nodes[2]];
                                    printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                           ,local_258,0x3f,(ulong)(uint)local_240->ref_mpi->id,
                                           (long)new_nodes[0],(ulong)(uint)pRVar13[new_nodes[0]],
                                           (long)new_nodes[1],(ulong)local_108,(long)new_nodes[2],
                                           local_130,(long)new_nodes[3],
                                           (ulong)(uint)pRVar13[new_nodes[3]]);
                                    ref_node_location(pRVar17,new_nodes[0]);
                                    ref_node_location(pRVar17,new_nodes[1]);
                                    ref_node_location(pRVar17,new_nodes[2]);
                                    ref_node_location(pRVar17,new_nodes[3]);
                                  }
                                  new_nodes[0] = (REF_INT)local_148;
                                  new_nodes[1] = RVar8;
                                  new_nodes[2] = (REF_INT)local_128;
                                  new_nodes[3] = local_e8._0_4_;
                                  uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                                  if (uVar7 == 0) {
                                    uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0);
                                    pRVar17 = local_240;
                                    if (uVar7 == 0) {
                                      if ((double)CONCAT44(uStack_24c,e0) < local_240->min_volume) {
                                        pRVar13 = local_240->part;
                                        local_128 = (REF_CELL)(ulong)(uint)pRVar13[new_nodes[1]];
                                        local_108 = pRVar13[new_nodes[2]];
                                        uStack_104 = 0;
                                        printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                               ,local_258,0x3f,(ulong)(uint)local_240->ref_mpi->id,
                                               (long)new_nodes[0],(ulong)(uint)pRVar13[new_nodes[0]]
                                               ,(long)new_nodes[1],local_128,(long)new_nodes[2],
                                               (ulong)local_108,(long)new_nodes[3],
                                               (ulong)(uint)pRVar13[new_nodes[3]]);
                                        ref_node_location(pRVar17,new_nodes[0]);
                                        ref_node_location(pRVar17,new_nodes[1]);
                                        ref_node_location(pRVar17,new_nodes[2]);
                                        ref_node_location(pRVar17,new_nodes[3]);
                                      }
                                      new_nodes[0] = (REF_INT)local_148;
                                      new_nodes[1] = RVar8;
                                      new_nodes[2] = local_e8._0_4_;
                                      new_nodes[3] = local_c8._0_4_;
                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                                      if (uVar7 == 0) {
                                        uVar7 = ref_node_tet_vol(local_240,new_nodes,(REF_DBL *)&e0)
                                        ;
                                        pRVar17 = local_240;
                                        if (uVar7 == 0) {
                                          if ((double)CONCAT44(uStack_24c,e0) <
                                              local_240->min_volume) {
                                            pRVar13 = local_240->part;
                                            local_128 = (REF_CELL)(ulong)(uint)pRVar13[new_nodes[1]]
                                            ;
                                            local_e8._0_8_ = CONCAT44(0,pRVar13[new_nodes[2]]);
                                            printf(
                                                  "%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                                  ,local_258,0x3f,
                                                  (ulong)(uint)local_240->ref_mpi->id,
                                                  (long)new_nodes[0],
                                                  (ulong)(uint)pRVar13[new_nodes[0]],
                                                  (long)new_nodes[1],local_128,(long)new_nodes[2],
                                                  CONCAT44(0,pRVar13[new_nodes[2]]),
                                                  (long)new_nodes[3],
                                                  (ulong)(uint)pRVar13[new_nodes[3]]);
                                            ref_node_location(pRVar17,new_nodes[0]);
                                            ref_node_location(pRVar17,new_nodes[1]);
                                            ref_node_location(pRVar17,new_nodes[2]);
                                            ref_node_location(pRVar17,new_nodes[3]);
                                          }
                                          new_nodes[0] = (REF_INT)local_148;
                                          new_nodes[1] = RVar8;
                                          new_nodes[2] = local_c8._0_4_;
                                          new_nodes[3] = (uint)local_110;
                                          uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
                                          if (uVar7 == 0) {
                                            uVar7 = ref_node_tet_vol(local_240,new_nodes,
                                                                     (REF_DBL *)&e0);
                                            pRVar3 = local_240;
                                            pRVar17 = local_258;
                                            if (uVar7 == 0) {
                                              if ((double)CONCAT44(uStack_24c,e0) <
                                                  local_240->min_volume) {
                                                pRVar13 = local_240->part;
                                                local_148 = (REF_CELL)
                                                            (ulong)(uint)pRVar13[new_nodes[1]];
                                                local_128 = (REF_CELL)
                                                            (ulong)(uint)pRVar13[new_nodes[2]];
                                                printf(
                                                  "%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                                  ,local_258,0x3f,
                                                  (ulong)(uint)local_240->ref_mpi->id,
                                                  (long)new_nodes[0],
                                                  (ulong)(uint)pRVar13[new_nodes[0]],
                                                  (long)new_nodes[1],local_148,(long)new_nodes[2],
                                                  local_128,(long)new_nodes[3],
                                                  (ulong)(uint)pRVar13[new_nodes[3]]);
                                                ref_node_location(pRVar3,new_nodes[0]);
                                                ref_node_location(pRVar3,new_nodes[1]);
                                                ref_node_location(pRVar3,new_nodes[2]);
                                                ref_node_location(pRVar3,new_nodes[3]);
                                              }
                                              goto LAB_001e5dc4;
                                            }
                                            pcVar19 = "edge split vol";
                                          }
                                          else {
                                            pcVar19 = "add";
                                          }
                                          uVar28 = (ulong)uVar7;
                                          uVar15 = 0x6f6;
                                          goto LAB_001e4ede;
                                        }
                                        pcVar19 = "edge split vol";
                                      }
                                      else {
                                        pcVar19 = "add";
                                      }
                                      uVar28 = (ulong)uVar7;
                                      uVar15 = 0x6f5;
                                      goto LAB_001e4ede;
                                    }
                                    pcVar19 = "edge split vol";
                                  }
                                  else {
                                    pcVar19 = "add";
                                  }
                                  uVar28 = (ulong)uVar7;
                                  uVar15 = 0x6f4;
                                  goto LAB_001e4ede;
                                }
                                pcVar19 = "edge split vol";
                              }
                              else {
                                pcVar19 = "add";
                              }
                              uVar28 = (ulong)uVar7;
                              uVar15 = 0x6f3;
                              goto LAB_001e4ede;
                            }
                            pcVar19 = "edge split vol";
                          }
                          else {
                            pcVar19 = "add";
                          }
                          uVar28 = (ulong)uVar7;
                          uVar15 = 0x6f2;
                          goto LAB_001e4ede;
                        }
                        pcVar19 = "edge split vol";
                      }
                      else {
                        pcVar19 = "add";
                      }
                      uVar28 = (ulong)uVar7;
                      uVar15 = 0x6f1;
                      goto LAB_001e4ede;
                    }
                    pcVar19 = "edge split vol";
                  }
                  else {
                    pcVar19 = "add";
                  }
                  uVar28 = (ulong)uVar7;
                  uVar15 = 0x6f0;
                  goto LAB_001e4ede;
                }
                pcVar19 = "edge split vol";
              }
              else {
                pcVar19 = "add";
              }
              uVar28 = (ulong)uVar7;
              uVar15 = 0x6ef;
              goto LAB_001e4ede;
            }
            *(undefined4 *)((long)pvVar11 + (long)pRVar17 * 4) = 1;
            if (uVar7 == 0x15) {
              auVar24._4_4_ = nodes[0];
              auVar24._0_4_ = nodes[1];
              auVar24._8_4_ = nodes[1];
              auVar24._12_4_ = nodes[2];
LAB_001e5b92:
              nodes[0] = auVar24._0_4_;
              nodes[1] = auVar24._4_4_;
              nodes[2] = auVar24._8_4_;
              nodes[3] = auVar24._12_4_;
            }
            else {
              if (uVar7 == 0x26) {
                auVar24._4_4_ = nodes[1];
                auVar24._0_4_ = nodes[2];
                auVar24._8_4_ = nodes[0];
                auVar24._12_4_ = nodes[1];
                goto LAB_001e5b92;
              }
              if (uVar7 == 0x38) {
                auVar24._8_4_ = RVar27;
                auVar24._0_4_ = nodes[1];
                auVar24._4_4_ = nodes[2];
                auVar24._12_4_ = nodes[0];
                goto LAB_001e5b92;
              }
            }
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              new_nodes[lVar14] = nodes[lVar14];
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6ad;
              goto LAB_001e4ede;
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6b0;
              goto LAB_001e4ede;
            }
            uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "add";
              uVar15 = 0x6b1;
              goto LAB_001e4ede;
            }
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              new_nodes[lVar14] = nodes[lVar14];
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[0],new_nodes);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6b7;
              goto LAB_001e4ede;
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6ba;
              goto LAB_001e4ede;
            }
            uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "add";
              uVar15 = 0x6bb;
              goto LAB_001e4ede;
            }
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              new_nodes[lVar14] = nodes[lVar14];
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6c1;
              goto LAB_001e4ede;
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[1],new_nodes + 1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6c4;
              goto LAB_001e4ede;
            }
            uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "add";
              uVar15 = 0x6c5;
              goto LAB_001e4ede;
            }
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              new_nodes[lVar14] = nodes[lVar14];
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6cb;
              goto LAB_001e4ede;
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6ce;
              goto LAB_001e4ede;
            }
            uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes + 2);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "mis";
              uVar15 = 0x6d1;
              goto LAB_001e4ede;
            }
            uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e1);
            pRVar17 = local_258;
            if (uVar7 != 0) {
              uVar28 = (ulong)uVar7;
              pcVar19 = "add";
              uVar15 = 0x6d2;
              goto LAB_001e4ede;
            }
          }
LAB_001e5dc4:
          pRVar17 = (REF_NODE)((long)&pRVar17->n + 1);
        }
        for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1) {
          if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
            uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "remove";
              uVar15 = 0x701;
              goto LAB_001e4ede;
            }
            uVar28 = (ulong)(uint)pRVar1->max;
          }
        }
        for (iVar20 = 0; iVar20 < ref_cell_split->max; iVar20 = iVar20 + 1) {
          RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
          if (RVar10 == 0) {
            uVar7 = ref_subdiv_add_local_cell(ref_subdiv,pRVar1,nodes);
            uVar28 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar19 = "add local";
              uVar15 = 0x704;
              goto LAB_001e4ede;
            }
          }
        }
        uVar7 = ref_cell_free(ref_cell_split);
        uVar28 = (ulong)uVar7;
        if (uVar7 == 0) {
          free(pvVar11);
          pRVar1 = ref_subdiv->grid->cell[10];
          lVar14 = (long)pRVar1->max;
          if (lVar14 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x586,"ref_subdiv_split_pri","malloc marked_for_removal of REF_INT negative");
            uVar28 = 1;
          }
          else {
            pvVar11 = malloc(lVar14 * 4);
            if (pvVar11 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x586,"ref_subdiv_split_pri","malloc marked_for_removal of REF_INT NULL");
              uVar28 = 2;
            }
            else {
              for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
                *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
              }
              uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
              uVar28 = (ulong)uVar7;
              if (uVar7 == 0) {
                uVar18 = 0;
                while( true ) {
                  uVar28 = (ulong)pRVar1->max;
                  iVar20 = (int)uVar18;
                  if ((long)uVar28 <= (long)uVar18) break;
                  if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] != -1) {
                    uVar7 = ref_subdiv_map(ref_subdiv,pRVar1,iVar20);
                    uVar9 = ref_cell_nodes(pRVar1,iVar20,nodes);
                    uVar28 = (ulong)uVar9;
                    if (uVar9 != 0) {
                      pcVar19 = "nodes";
                      uVar15 = 0x58b;
                      goto LAB_001e6207;
                    }
                    if (uVar7 != 0) {
                      if (uVar7 == 0x1cb) {
                        *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5ed;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5f0;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5f3;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[4],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5f6;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[5],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5f9;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5fa;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5fd;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[0],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x600;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x603;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[4],nodes[3],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x606;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[4],nodes[5],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x609;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x60a;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x60d;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[1],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x610;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x613;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[5],nodes[4],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x616;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[5],nodes[3],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x619;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x61a;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x61f;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x622;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x625;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[4],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x629;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[4],nodes[5],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x62c;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[5],nodes[3],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x62f;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x630;
                          goto LAB_001e6207;
                        }
                      }
                      else if (uVar7 == 0x41) {
                        *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5ad;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5b0;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[4],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5b3;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5b4;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5b6;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5b9;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[4],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5bc;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5bd;
                          goto LAB_001e6207;
                        }
                      }
                      else if (uVar7 == 0x82) {
                        *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5c2;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5c5;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[5],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5c8;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5c9;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5cb;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5ce;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[3],nodes[5],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5d1;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5d2;
                          goto LAB_001e6207;
                        }
                      }
                      else if (uVar7 == 0x108) {
                        *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5d7;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5da;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[4],nodes[5],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5dd;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5de;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x5e0;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5e3;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[4],nodes[5],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5e6;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5e7;
                          goto LAB_001e6207;
                        }
                      }
                      else {
                        if (uVar7 != 0x34) {
                          ref_subdiv_map_to_edge(uVar7);
                          printf("pri %d, map %d\n",uVar18 & 0xffffffff,(ulong)uVar7);
                          pcVar19 = "map not implemented yet";
                          uVar28 = 6;
                          uVar15 = 0x636;
                          goto LAB_001e6207;
                        }
                        *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x592;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[3],new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x595;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[4],new_nodes + 1);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x598;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[5],new_nodes + 2);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x59b;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x59c;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "nodes";
                          uVar15 = 0x59e;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[3],new_nodes + 3);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5a1;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[4],new_nodes + 4);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5a4;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[5],new_nodes + 5);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "mis";
                          uVar15 = 0x5a7;
                          goto LAB_001e6207;
                        }
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 != 0) {
                          pcVar19 = "add";
                          uVar15 = 0x5a8;
                          goto LAB_001e6207;
                        }
                      }
                    }
                  }
                  uVar18 = uVar18 + 1;
                }
                for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1) {
                  if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
                    uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
                    uVar28 = (ulong)uVar7;
                    if (uVar7 != 0) {
                      pcVar19 = "remove";
                      uVar15 = 0x63c;
                      goto LAB_001e6207;
                    }
                    uVar28 = (ulong)(uint)pRVar1->max;
                  }
                }
                for (iVar20 = 0; iVar20 < ref_cell_split->max; iVar20 = iVar20 + 1) {
                  RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
                  if (RVar10 == 0) {
                    uVar7 = ref_subdiv_add_local_cell(ref_subdiv,pRVar1,nodes);
                    uVar28 = (ulong)uVar7;
                    if (uVar7 != 0) {
                      pcVar19 = "add local";
                      uVar15 = 0x63f;
                      goto LAB_001e6207;
                    }
                  }
                }
                uVar7 = ref_cell_free(ref_cell_split);
                uVar28 = (ulong)uVar7;
                if (uVar7 == 0) {
                  free(pvVar11);
                  pRVar1 = ref_subdiv->grid->cell[9];
                  lVar14 = (long)pRVar1->max;
                  if (lVar14 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x719,"ref_subdiv_split_pyr",
                           "malloc marked_for_removal of REF_INT negative");
                    uVar28 = 1;
                  }
                  else {
                    pvVar11 = malloc(lVar14 * 4);
                    if (pvVar11 == (void *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x719,"ref_subdiv_split_pyr",
                             "malloc marked_for_removal of REF_INT NULL");
                      uVar28 = 2;
                    }
                    else {
                      for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
                        *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
                      }
                      uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
                      uVar28 = (ulong)uVar7;
                      if (uVar7 == 0) {
                        local_258 = (REF_NODE)ref_subdiv->grid->cell[10];
                        uVar7 = ref_cell_create((REF_CELL *)&e0,local_258->n);
                        uVar28 = (ulong)uVar7;
                        if (uVar7 == 0) {
                          local_240 = (REF_NODE)ref_subdiv->grid->cell[8];
                          uVar7 = ref_cell_create((REF_CELL *)&e1,local_240->n);
                          uVar28 = (ulong)uVar7;
                          if (uVar7 == 0) {
                            uVar18 = 0;
                            while( true ) {
                              uVar28 = (ulong)pRVar1->max;
                              iVar20 = (int)uVar18;
                              if ((long)uVar28 <= (long)uVar18) break;
                              if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] != -1) {
                                uVar7 = ref_subdiv_map(ref_subdiv,pRVar1,iVar20);
                                uVar9 = ref_cell_nodes(pRVar1,iVar20,nodes);
                                uVar28 = (ulong)uVar9;
                                if (uVar9 != 0) {
                                  pcVar19 = "nodes";
                                  uVar15 = 0x725;
                                  goto LAB_001e7acc;
                                }
                                if (uVar7 != 0) {
                                  if (uVar7 == 0x14) {
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x741;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[3],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x744;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[4],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x747;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x748;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x74a;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[3],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x74d;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[4],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x750;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x751;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                  else if (uVar7 == 0x22) {
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x76b;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[2],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x76e;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[2],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x771;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x772;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x774;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x777;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[2],new_nodes + 5);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x77a;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_24c,e0),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x77b;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                  else if (uVar7 == 0x40) {
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x7c5;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7c8;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7c9;
                                      goto LAB_001e7acc;
                                    }
                                    new_nodes[0] = nodes[0];
                                    new_nodes[1] = nodes[1];
                                    new_nodes[2] = nodes[2];
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 2000;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_244,e1),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7d1;
                                      goto LAB_001e7acc;
                                    }
                                    new_nodes[0] = nodes[0];
                                    new_nodes[1] = nodes[2];
                                    new_nodes[2] = nodes[3];
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],new_nodes[1],
                                                       new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7d8;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_244,e1),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7d9;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                  else if (uVar7 == 0x48) {
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x756;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x759;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x75c;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x75d;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x75f;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x762;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 5);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x765;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_24c,e0),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x766;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                  else if (uVar7 == 0xeb) {
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x780;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[2],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x783;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x786;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[2],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x789;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x78c;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x78d;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[1],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x791;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[2],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x794;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[2],nodes[0],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x797;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[4],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x79a;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x79d;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[2],nodes[3],new_nodes + 5);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7a0;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_24c,e0),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7a1;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x7a3;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7a6;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7a9;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[4],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7ac;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[2],new_nodes + 5);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7af;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_24c,e0),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7b0;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x7b2;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[1],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7b5;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7b8;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[4],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7bb;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[4],nodes[2],new_nodes + 5);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x7be;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_24c,e0),new_nodes
                                                         ,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x7bf;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                  else {
                                    if (uVar7 != 0x81) {
                                      if (uVar7 != 0x8b) {
                                        if (uVar7 == 0xe1) {
                                          for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                            new_nodes[lVar14] = nodes[lVar14];
                                          }
                                          nodes[1] = new_nodes[3];
                                          nodes[0] = new_nodes[4];
                                          nodes[2] = new_nodes[2];
                                          nodes[3] = new_nodes[1];
                                          nodes[4] = new_nodes[0];
                                        }
                                        else {
                                          if (uVar7 != 0x5c) {
                                            ref_subdiv_map_to_edge(uVar7);
                                            printf("pyr %d, map %d\n",uVar18 & 0xffffffff,
                                                   (ulong)uVar7);
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x841,"ref_subdiv_split_pyr",6,
                                                  "map not implemented yet");
                                            uVar28 = 6;
                                            goto LAB_001e7ad6;
                                          }
                                          for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                            new_nodes[lVar14] = nodes[lVar14];
                                          }
                                          nodes[1] = new_nodes[4];
                                          nodes[0] = new_nodes[1];
                                          nodes[2] = new_nodes[2];
                                          nodes[3] = new_nodes[0];
                                          nodes[4] = new_nodes[3];
                                        }
                                      }
                                      *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                        new_nodes[lVar14] = nodes[lVar14];
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[0],nodes[1],new_nodes);
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x7f7;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[3],nodes[4],new_nodes + 3)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x7fa;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[1],nodes[2],new_nodes + 2)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x7fd;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "add";
                                        uVar15 = 0x7fe;
                                        goto LAB_001e7acc;
                                      }
                                      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                        new_nodes[lVar14] = nodes[lVar14];
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[0],nodes[1],new_nodes + 1)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x803;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[3],nodes[4],new_nodes + 4)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x806;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[0],nodes[2],new_nodes + 2)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x809;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "add";
                                        uVar15 = 0x80a;
                                        goto LAB_001e7acc;
                                      }
                                      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                        new_nodes[lVar14] = nodes[lVar14];
                                      }
                                      new_nodes[0] = new_nodes[4];
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[3],nodes[4],new_nodes + 1)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x811;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[1],nodes[2],new_nodes + 3)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x814;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_244,e1),
                                                           new_nodes,&e2);
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "add";
                                        uVar15 = 0x815;
                                        goto LAB_001e7acc;
                                      }
                                      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                        new_nodes[lVar14] = nodes[lVar14];
                                      }
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[3],nodes[4],new_nodes);
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x81a;
                                        goto LAB_001e7acc;
                                      }
                                      new_nodes[1] = new_nodes[3];
                                      uVar7 = ref_subdiv_node_between
                                                        (ref_subdiv,nodes[0],nodes[2],new_nodes + 3)
                                      ;
                                      uVar28 = (ulong)uVar7;
                                      if (uVar7 != 0) {
                                        pcVar19 = "mis";
                                        uVar15 = 0x81e;
                                        goto LAB_001e7acc;
                                      }
                                      uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_244,e1),
                                                           new_nodes,&e2);
                                      if (uVar7 == 0) {
                                        for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                          new_nodes[lVar14] = nodes[lVar14];
                                        }
                                        uVar7 = ref_subdiv_node_between
                                                          (ref_subdiv,nodes[0],nodes[2],new_nodes);
                                        if (uVar7 == 0) {
                                          uVar7 = ref_subdiv_node_between
                                                            (ref_subdiv,nodes[1],nodes[2],
                                                             new_nodes + 1);
                                          if (uVar7 == 0) {
                                            uVar7 = ref_subdiv_node_between
                                                              (ref_subdiv,nodes[3],nodes[4],
                                                               new_nodes + 3);
                                            if (uVar7 == 0) {
                                              uVar7 = ref_cell_add((REF_CELL)CONCAT44(uStack_244,e1)
                                                                   ,new_nodes,&e2);
                                              if (uVar7 == 0) {
                                                for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
                                                  new_nodes[lVar14] = nodes[lVar14];
                                                }
                                                uVar7 = ref_subdiv_node_between
                                                                  (ref_subdiv,nodes[0],nodes[2],
                                                                   new_nodes);
                                                if (uVar7 == 0) {
                                                  uVar7 = ref_subdiv_node_between
                                                                    (ref_subdiv,nodes[0],nodes[1],
                                                                     new_nodes + 1);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[2],
                                                                       new_nodes + 2);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[3],
                                                                         nodes[4],new_nodes + 3);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add((REF_CELL)
                                                                             CONCAT44(uStack_244,e1)
                                                                             ,new_nodes,&e2);
                                                        if (uVar7 == 0) goto LAB_001e8895;
                                                        pcVar19 = "add";
                                                        uVar15 = 0x83b;
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x83a;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x837;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x834;
                                                  }
                                                }
                                                else {
                                                  pcVar19 = "mis";
                                                  uVar15 = 0x831;
                                                }
                                              }
                                              else {
                                                pcVar19 = "add";
                                                uVar15 = 0x82c;
                                              }
                                            }
                                            else {
                                              pcVar19 = "mis";
                                              uVar15 = 0x82b;
                                            }
                                          }
                                          else {
                                            pcVar19 = "mis";
                                            uVar15 = 0x828;
                                          }
                                        }
                                        else {
                                          pcVar19 = "mis";
                                          uVar15 = 0x825;
                                        }
                                      }
                                      else {
                                        pcVar19 = "add";
                                        uVar15 = 0x81f;
                                      }
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                             ,uVar15,"ref_subdiv_split_pyr",(ulong)uVar7,pcVar19);
                                      uVar28 = (ulong)uVar7;
                                      goto LAB_001e7ad6;
                                    }
                                    *(undefined4 *)((long)pvVar11 + uVar18 * 4) = 1;
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x72c;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[1],new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x72f;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[4],new_nodes + 3);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x732;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x733;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "nodes";
                                      uVar15 = 0x735;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x738;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_subdiv_node_between
                                                      (ref_subdiv,nodes[3],nodes[4],new_nodes + 4);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "mis";
                                      uVar15 = 0x73b;
                                      goto LAB_001e7acc;
                                    }
                                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e2);
                                    uVar28 = (ulong)uVar7;
                                    if (uVar7 != 0) {
                                      pcVar19 = "add";
                                      uVar15 = 0x73c;
                                      goto LAB_001e7acc;
                                    }
                                  }
                                }
                              }
LAB_001e8895:
                              uVar18 = uVar18 + 1;
                            }
                            for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1) {
                              if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
                                uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
                                if (uVar7 != 0) {
                                  uVar28 = (ulong)uVar7;
                                  pcVar19 = "remove";
                                  uVar15 = 0x847;
                                  goto LAB_001e8de0;
                                }
                                uVar28 = (ulong)(uint)pRVar1->max;
                              }
                            }
                            for (iVar20 = 0; iVar20 < ref_cell_split->max; iVar20 = iVar20 + 1) {
                              RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
                              if ((RVar10 == 0) &&
                                 (uVar7 = ref_subdiv_add_local_cell(ref_subdiv,pRVar1,nodes),
                                 uVar7 != 0)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                       ,0x84a,"ref_subdiv_split_pyr",(ulong)uVar7,"add local");
                                uVar28 = (ulong)uVar7;
                                goto LAB_001e7ad6;
                              }
                            }
                            for (iVar20 = 0; iVar20 < ((REF_CELL)CONCAT44(uStack_24c,e0))->max;
                                iVar20 = iVar20 + 1) {
                              RVar10 = ref_cell_nodes((REF_CELL)CONCAT44(uStack_24c,e0),iVar20,nodes
                                                     );
                              if ((RVar10 == 0) &&
                                 (uVar7 = ref_subdiv_add_local_cell
                                                    (ref_subdiv,(REF_CELL)local_258,nodes),
                                 uVar7 != 0)) {
                                uVar28 = (ulong)uVar7;
                                pcVar19 = "add local";
                                uVar15 = 0x84d;
                                goto LAB_001e8de0;
                              }
                            }
                            iVar20 = 0;
LAB_001e897f:
                            if (iVar20 < ((REF_CELL)CONCAT44(uStack_244,e1))->max) {
                              RVar10 = ref_cell_nodes((REF_CELL)CONCAT44(uStack_244,e1),iVar20,nodes
                                                     );
                              if ((RVar10 != 0) ||
                                 (uVar7 = ref_subdiv_add_local_cell
                                                    (ref_subdiv,(REF_CELL)local_240,nodes),
                                 uVar7 == 0)) goto LAB_001e89b1;
                              uVar28 = (ulong)uVar7;
                              pcVar19 = "add local";
                              uVar15 = 0x850;
LAB_001e8de0:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                     ,uVar15,"ref_subdiv_split_pyr",uVar28,pcVar19);
                              goto LAB_001e7ad6;
                            }
                            uVar7 = ref_cell_free(ref_cell_split);
                            if (uVar7 == 0) {
                              uVar7 = ref_cell_free((REF_CELL)CONCAT44(uStack_24c,e0));
                              if (uVar7 == 0) {
                                uVar7 = ref_cell_free((REF_CELL)CONCAT44(uStack_244,e1));
                                if (uVar7 == 0) {
                                  free(pvVar11);
                                  pRVar1 = ref_subdiv->grid->cell[6];
                                  lVar14 = (long)pRVar1->max;
                                  if (lVar14 < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                           ,0x414,"ref_subdiv_split_qua",
                                           "malloc marked_for_removal of REF_INT negative");
                                    uVar28 = 1;
                                  }
                                  else {
                                    pvVar11 = malloc(lVar14 * 4);
                                    if (pvVar11 == (void *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                             ,0x414,"ref_subdiv_split_qua",
                                             "malloc marked_for_removal of REF_INT NULL");
                                      uVar28 = 2;
                                    }
                                    else {
                                      for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
                                        *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
                                      }
                                      uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
                                      if (uVar7 == 0) {
                                        for (lVar14 = 0; uVar28 = (ulong)pRVar1->max,
                                            lVar14 < (long)uVar28; lVar14 = lVar14 + 1) {
                                          iVar20 = (int)lVar14;
                                          if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] ==
                                              -1) goto LAB_001e9e04;
                                          uVar7 = ref_cell_nodes(pRVar1,iVar20,nodes);
                                          if (uVar7 != 0) {
                                            pcVar19 = "nodes";
                                            uVar15 = 0x419;
LAB_001ea318:
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,uVar15,"ref_subdiv_split_qua",(ulong)uVar7,
                                                  pcVar19);
                                            uVar28 = (ulong)uVar7;
                                            goto LAB_001e9a5a;
                                          }
                                          uVar7 = ref_edge_with(ref_subdiv->edge,nodes[0],nodes[1],
                                                                &e1);
                                          if (uVar7 != 0) {
                                            pcVar19 = "e01";
                                            uVar15 = 0x41b;
                                            goto LAB_001ea318;
                                          }
                                          uVar7 = ref_edge_with(ref_subdiv->edge,nodes[1],nodes[2],
                                                                &e2);
                                          if (uVar7 != 0) {
                                            pcVar19 = "e12";
                                            uVar15 = 0x41d;
                                            goto LAB_001ea318;
                                          }
                                          uVar7 = ref_edge_with(ref_subdiv->edge,nodes[2],nodes[3],
                                                                &e3);
                                          if (uVar7 != 0) {
                                            pcVar19 = "e23";
                                            uVar15 = 0x41f;
                                            goto LAB_001ea318;
                                          }
                                          uVar7 = ref_edge_with(ref_subdiv->edge,nodes[3],nodes[0],
                                                                &e4);
                                          if (uVar7 != 0) {
                                            pcVar19 = "e30";
                                            uVar15 = 0x421;
                                            goto LAB_001ea318;
                                          }
                                          pRVar13 = ref_subdiv->mark;
                                          iVar21 = pRVar13[e1];
                                          if (iVar21 != 0) {
                                            if (pRVar13[e3] == 0) {
LAB_001e9e0c:
                                              uVar28 = 6;
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x42b,"ref_subdiv_split_qua",6,
                                                  "quad edges not paired");
                                            }
                                            else {
                                              if ((pRVar13[e2] == 0) || (pRVar13[e4] == 0))
                                              goto LAB_001e9bc0;
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x426,"ref_subdiv_split_qua",6,"all quad edges");
                                              uVar28 = 6;
                                            }
                                            goto LAB_001e9a5a;
                                          }
LAB_001e9bc0:
                                          if ((iVar21 != pRVar13[e3]) ||
                                             (iVar22 = pRVar13[e2], iVar22 != pRVar13[e4]))
                                          goto LAB_001e9e0c;
                                          if (iVar21 != 0) {
                                            *(undefined4 *)((long)pvVar11 + lVar14 * 4) = 1;
                                            uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                            if (uVar7 == 0) {
                                              uVar7 = ref_subdiv_node_between
                                                                (ref_subdiv,nodes[0],nodes[1],
                                                                 new_nodes + 1);
                                              if (uVar7 == 0) {
                                                uVar7 = ref_subdiv_node_between
                                                                  (ref_subdiv,nodes[2],nodes[3],
                                                                   new_nodes + 2);
                                                if (uVar7 == 0) {
                                                  uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0)
                                                  ;
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[0],
                                                                         nodes[1],new_nodes);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_subdiv_node_between
                                                                          (ref_subdiv,nodes[2],
                                                                           nodes[3],new_nodes + 3);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_add(ref_cell_split,
                                                                               new_nodes,&e0);
                                                          if (uVar7 == 0) {
                                                            pRVar13 = ref_subdiv->mark;
                                                            iVar22 = pRVar13[e2];
                                                            goto LAB_001e9cf2;
                                                          }
                                                          pcVar19 = "add";
                                                          uVar15 = 0x441;
                                                        }
                                                        else {
                                                          pcVar19 = "mis";
                                                          uVar15 = 0x440;
                                                        }
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x43d;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "nodes";
                                                      uVar15 = 0x43a;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x438;
                                                  }
                                                }
                                                else {
                                                  pcVar19 = "mis";
                                                  uVar15 = 0x437;
                                                }
                                              }
                                              else {
                                                pcVar19 = "mis";
                                                uVar15 = 0x434;
                                              }
                                            }
                                            else {
                                              pcVar19 = "nodes";
                                              uVar15 = 0x431;
                                            }
                                            goto LAB_001ea318;
                                          }
LAB_001e9cf2:
                                          if ((iVar22 != 0) && (pRVar13[e4] != 0)) {
                                            *(undefined4 *)((long)pvVar11 + lVar14 * 4) = 1;
                                            uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                            if (uVar7 == 0) {
                                              uVar7 = ref_subdiv_node_between
                                                                (ref_subdiv,nodes[1],nodes[2],
                                                                 new_nodes + 2);
                                              if (uVar7 == 0) {
                                                uVar7 = ref_subdiv_node_between
                                                                  (ref_subdiv,nodes[3],nodes[0],
                                                                   new_nodes + 3);
                                                if (uVar7 == 0) {
                                                  uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0)
                                                  ;
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[1],
                                                                         nodes[2],new_nodes + 1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_subdiv_node_between
                                                                          (ref_subdiv,nodes[3],
                                                                           nodes[0],new_nodes);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_add(ref_cell_split,
                                                                               new_nodes,&e0);
                                                          if (uVar7 == 0) goto LAB_001e9e04;
                                                          pcVar19 = "add";
                                                          uVar15 = 0x458;
                                                        }
                                                        else {
                                                          pcVar19 = "mis";
                                                          uVar15 = 0x457;
                                                        }
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x454;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "nodes";
                                                      uVar15 = 0x451;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x44f;
                                                  }
                                                }
                                                else {
                                                  pcVar19 = "mis";
                                                  uVar15 = 0x44e;
                                                }
                                              }
                                              else {
                                                pcVar19 = "mis";
                                                uVar15 = 1099;
                                              }
                                            }
                                            else {
                                              pcVar19 = "nodes";
                                              uVar15 = 0x448;
                                            }
                                            goto LAB_001ea318;
                                          }
LAB_001e9e04:
                                        }
                                        for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1)
                                        {
                                          if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
                                            uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
                                            if (uVar7 != 0) {
                                              pcVar19 = "remove";
                                              uVar15 = 0x45e;
                                              goto LAB_001e99f1;
                                            }
                                            uVar28 = (ulong)(uint)pRVar1->max;
                                          }
                                        }
                                        for (iVar20 = 0; iVar20 < ref_cell_split->max;
                                            iVar20 = iVar20 + 1) {
                                          RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
                                          if ((RVar10 == 0) &&
                                             (uVar7 = ref_subdiv_add_local_cell
                                                                (ref_subdiv,pRVar1,nodes),
                                             uVar7 != 0)) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x461,"ref_subdiv_split_qua",(ulong)uVar7,
                                                  "add local");
                                            uVar28 = (ulong)uVar7;
                                            goto LAB_001e9a5a;
                                          }
                                        }
                                        uVar7 = ref_cell_free(ref_cell_split);
                                        if (uVar7 == 0) {
                                          free(pvVar11);
                                          pRVar1 = ref_subdiv->grid->cell[3];
                                          lVar14 = (long)pRVar1->max;
                                          if (lVar14 < 0) {
                                            printf("%s: %d: %s: %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x476,"ref_subdiv_split_tri",
                                                  "malloc marked_for_removal of REF_INT negative");
                                            uVar28 = 1;
                                          }
                                          else {
                                            pvVar11 = malloc(lVar14 * 4);
                                            if (pvVar11 != (void *)0x0) {
                                              for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1
                                                  ) {
                                                *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
                                              }
                                              uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
                                              if (uVar7 == 0) {
                                                local_240 = (REF_NODE)ref_subdiv->grid->cell[6];
                                                uVar7 = ref_cell_create((REF_CELL *)&e0,local_240->n
                                                                       );
                                                if (uVar7 == 0) {
                                                  local_258 = (REF_NODE)0x0;
LAB_001ea415:
                                                  uVar28 = (ulong)pRVar1->max;
                                                  if ((long)uVar28 <= (long)local_258)
                                                  goto LAB_001eace6;
                                                  if (pRVar1->c2n
                                                      [(long)(int)local_258 * (long)pRVar1->size_per
                                                      ] == -1) goto LAB_001eacdc;
                                                  uVar7 = ref_cell_nodes(pRVar1,(int)local_258,nodes
                                                                        );
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_edge_with(ref_subdiv->edge,nodes[0],
                                                                          nodes[1],&e2);
                                                    if (uVar7 != 0) {
                                                      pcVar19 = "e01";
                                                      uVar15 = 0x480;
                                                      goto LAB_001eb71f;
                                                    }
                                                    uVar7 = ref_edge_with(ref_subdiv->edge,nodes[1],
                                                                          nodes[2],&e3);
                                                    if (uVar7 != 0) {
                                                      pcVar19 = "e12";
                                                      uVar15 = 0x482;
                                                      goto LAB_001eb71f;
                                                    }
                                                    uVar7 = ref_edge_with(ref_subdiv->edge,nodes[2],
                                                                          nodes[0],&e4);
                                                    if (uVar7 != 0) {
                                                      pcVar19 = "e20";
                                                      uVar15 = 0x484;
                                                      goto LAB_001eb71f;
                                                    }
                                                    pRVar13 = ref_subdiv->mark;
                                                    iVar20 = pRVar13[e3];
                                                    if (pRVar13[e2] == 0) {
                                                      if (iVar20 != 0) {
                                                        if (pRVar13[e4] == 0) {
LAB_001eab45:
                                                          *(undefined4 *)
                                                           ((long)pvVar11 + (long)local_258 * 4) = 1
                                                          ;
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[2],
                                                                       new_nodes + 1);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,
                                                                           &e1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[2],
                                                                       new_nodes + 2);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,
                                                                           &e1);
                                                      if (uVar7 == 0) {
                                                        pRVar13 = ref_subdiv->mark;
                                                        goto LAB_001eac0c;
                                                      }
                                                      pcVar19 = "add";
                                                      uVar15 = 0x522;
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x521;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x51e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x51d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x51c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x519;
                                                  }
                                                  }
                                                  else {
                                                    *(undefined4 *)
                                                     ((long)pvVar11 + (long)local_258 * 4) = 1;
                                                    uVar7 = ref_cell_nodes(pRVar1,(REF_INT)local_258
                                                                           ,new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[2],
                                                                         nodes[1],new_nodes + 1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_subdiv_node_between
                                                                          (ref_subdiv,nodes[2],
                                                                           nodes[0],new_nodes);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_add(ref_cell_split,
                                                                               new_nodes,&e1);
                                                          if (uVar7 == 0) {
                                                            uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    new_nodes[4] = new_nodes[3];
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[2],nodes[1],
                                                                       new_nodes + 2);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[2],
                                                                         nodes[0],new_nodes + 3);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add((REF_CELL)
                                                                             CONCAT44(uStack_24c,e0)
                                                                             ,new_nodes,&e1);
                                                        if (uVar7 == 0) goto LAB_001eacdc;
                                                        pcVar19 = "add";
                                                        uVar15 = 0x4ec;
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x4eb;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x4e8;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x4e4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x4e2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4e1;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4de;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x4db;
                                                  }
                                                  }
                                                  goto LAB_001eb71f;
                                                  }
LAB_001eac0c:
                                                  if (pRVar13[e4] != 0) {
                                                    *(undefined4 *)
                                                     ((long)pvVar11 + (long)local_258 * 4) = 1;
                                                    uVar7 = ref_cell_nodes(pRVar1,(REF_INT)local_258
                                                                           ,new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[2],
                                                                         nodes[0],new_nodes + 2);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add(ref_cell_split,
                                                                             new_nodes,&e1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[2],nodes[0],
                                                                       new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,
                                                                           &e1);
                                                      if (uVar7 == 0) goto LAB_001eacdc;
                                                      pcVar19 = "add";
                                                      uVar15 = 0x530;
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x52f;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x52c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x52b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x52a;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x527;
                                                  }
                                                  goto LAB_001eb71f;
                                                  }
LAB_001eacdc:
                                                  local_258 = (REF_NODE)((long)&local_258->n + 1);
                                                  goto LAB_001ea415;
                                                  }
                                                  iVar21 = pRVar13[e4];
                                                  *(undefined4 *)
                                                   ((long)pvVar11 + (long)local_258 * 4) = 1;
                                                  uVar7 = ref_cell_nodes(pRVar1,(REF_INT)local_258,
                                                                         new_nodes);
                                                  uVar28 = (ulong)uVar7;
                                                  if (iVar20 == 0) {
                                                    if (iVar21 == 0) {
                                                      if (uVar7 != 0) {
                                                        uVar15 = 0x50b;
                                                        goto LAB_001eb465;
                                                      }
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[0],
                                                                         nodes[1],new_nodes);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add(ref_cell_split,
                                                                             new_nodes,&e1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[0],nodes[1],
                                                                       new_nodes + 1);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,
                                                                           &e1);
                                                      if (uVar7 == 0) {
                                                        pRVar13 = ref_subdiv->mark;
                                                        if (pRVar13[e3] != 0) goto LAB_001eab45;
                                                        goto LAB_001eac0c;
                                                      }
                                                      pcVar19 = "add";
                                                      uVar15 = 0x514;
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x513;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x510;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x50f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x50e;
                                                  }
                                                  }
                                                  else {
                                                    if (uVar7 != 0) {
                                                      uVar15 = 0x4f4;
                                                      goto LAB_001eb465;
                                                    }
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[0],nodes[1],
                                                                       new_nodes + 1);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[0],
                                                                         nodes[2],new_nodes + 2);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add(ref_cell_split,
                                                                             new_nodes,&e1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    new_nodes[4] = new_nodes[3];
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[0],nodes[1],
                                                                       new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[0],
                                                                         nodes[2],new_nodes + 3);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add((REF_CELL)
                                                                             CONCAT44(uStack_24c,e0)
                                                                             ,new_nodes,&e1);
                                                        if (uVar7 == 0) goto LAB_001eacdc;
                                                        pcVar19 = "add";
                                                        uVar15 = 0x505;
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x504;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x501;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x4fd;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x4fb;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4fa;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4f7;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (iVar21 != 0) {
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_subdiv_node_between
                                                                          (ref_subdiv,nodes[0],
                                                                           nodes[1],new_nodes + 1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_subdiv_node_between
                                                                            (ref_subdiv,nodes[0],
                                                                             nodes[2],new_nodes + 2)
                                                          ;
                                                          if (uVar7 == 0) {
                                                            uVar7 = ref_cell_add(ref_cell_split,
                                                                                 new_nodes,&e1);
                                                            if (uVar7 == 0) {
                                                              uVar7 = ref_cell_nodes(pRVar1,(REF_INT
                                                  )local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[0],
                                                                       new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[1],
                                                                         nodes[2],new_nodes + 2);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add(ref_cell_split,
                                                                             new_nodes,&e1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[2],nodes[1],
                                                                       new_nodes + 1);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[2],
                                                                         nodes[0],new_nodes);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add(ref_cell_split,
                                                                             new_nodes,&e1);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[0],nodes[1],
                                                                       new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[1],
                                                                         nodes[2],new_nodes + 1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_subdiv_node_between
                                                                          (ref_subdiv,nodes[2],
                                                                           nodes[0],new_nodes + 2);
                                                        if (uVar7 == 0) {
                                                          uVar7 = ref_cell_add(ref_cell_split,
                                                                               new_nodes,&e1);
                                                          if (uVar7 == 0) goto LAB_001eacdc;
                                                          pcVar19 = "add";
                                                          uVar15 = 0x4b3;
                                                        }
                                                        else {
                                                          pcVar19 = "mis";
                                                          uVar15 = 0x4b2;
                                                        }
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x4af;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x4ac;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x4a9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x4a6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4a5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4a2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x49f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x49c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x49b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x498;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x495;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x492;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x491;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x48e;
                                                  }
                                                  goto LAB_001eb71f;
                                                  }
                                                  uVar15 = 0x48b;
LAB_001eb465:
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,uVar15,"ref_subdiv_split_tri",uVar28,"nodes");
                                                  goto LAB_001eb896;
                                                  }
                                                  if (uVar7 != 0) {
                                                    uVar15 = 0x4c1;
                                                    goto LAB_001eb465;
                                                  }
                                                  uVar7 = ref_subdiv_node_between
                                                                    (ref_subdiv,nodes[1],nodes[2],
                                                                     new_nodes + 2);
                                                  if (uVar7 == 0) {
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[0],
                                                                       new_nodes);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_cell_add(ref_cell_split,new_nodes,
                                                                           &e1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_nodes(pRVar1,(REF_INT)
                                                  local_258,new_nodes);
                                                  RVar8 = new_nodes[3];
                                                  if (uVar7 == 0) {
                                                    new_nodes[3] = new_nodes[2];
                                                    new_nodes[4] = RVar8;
                                                    uVar7 = ref_subdiv_node_between
                                                                      (ref_subdiv,nodes[1],nodes[2],
                                                                       new_nodes + 2);
                                                    if (uVar7 == 0) {
                                                      uVar7 = ref_subdiv_node_between
                                                                        (ref_subdiv,nodes[1],
                                                                         nodes[0],new_nodes + 1);
                                                      if (uVar7 == 0) {
                                                        uVar7 = ref_cell_add((REF_CELL)
                                                                             CONCAT44(uStack_24c,e0)
                                                                             ,new_nodes,&e1);
                                                        if (uVar7 == 0) goto LAB_001eacdc;
                                                        pcVar19 = "add";
                                                        uVar15 = 0x4d3;
                                                      }
                                                      else {
                                                        pcVar19 = "mis";
                                                        uVar15 = 0x4d2;
                                                      }
                                                    }
                                                    else {
                                                      pcVar19 = "mis";
                                                      uVar15 = 0x4cf;
                                                    }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x4ca;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "add";
                                                    uVar15 = 0x4c8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4c7;
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "mis";
                                                    uVar15 = 0x4c4;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar19 = "nodes";
                                                    uVar15 = 0x47e;
                                                  }
LAB_001eb71f:
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,uVar15,"ref_subdiv_split_tri",(ulong)uVar7,
                                                  pcVar19);
                                                  uVar28 = (ulong)uVar7;
                                                  goto LAB_001eb896;
                                                }
                                                pcVar19 = "temp qua";
                                                uVar15 = 0x47b;
                                              }
                                              else {
                                                pcVar19 = "temp tri";
                                                uVar15 = 0x478;
                                              }
                                              goto LAB_001eb889;
                                            }
                                            printf("%s: %d: %s: %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                                  ,0x476,"ref_subdiv_split_tri",
                                                  "malloc marked_for_removal of REF_INT NULL");
                                            uVar28 = 2;
                                          }
                                          goto LAB_001eb896;
                                        }
                                        pcVar19 = "temp ref_cell free";
                                        uVar15 = 0x463;
                                      }
                                      else {
                                        pcVar19 = "temp cell";
                                        uVar15 = 0x416;
                                      }
LAB_001e99f1:
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                             ,uVar15,"ref_subdiv_split_qua",(ulong)uVar7,pcVar19);
                                      uVar28 = (ulong)uVar7;
                                    }
                                  }
LAB_001e9a5a:
                                  pcVar19 = "split qua";
                                  uVar15 = 0x882;
                                  goto LAB_001e3971;
                                }
                                pcVar19 = "temp pri free";
                                uVar15 = 0x854;
                              }
                              else {
                                pcVar19 = "temp pri free";
                                uVar15 = 0x853;
                              }
                            }
                            else {
                              pcVar19 = "temp pyr free";
                              uVar15 = 0x852;
                            }
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,uVar15,"ref_subdiv_split_pyr",(ulong)uVar7,pcVar19);
                            uVar28 = (ulong)uVar7;
                            goto LAB_001e7ad6;
                          }
                          pcVar19 = "temp pri";
                          uVar15 = 0x721;
                        }
                        else {
                          pcVar19 = "temp pri";
                          uVar15 = 0x71e;
                        }
                      }
                      else {
                        pcVar19 = "temp pyr";
                        uVar15 = 0x71b;
                      }
LAB_001e7acc:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,uVar15,"ref_subdiv_split_pyr",uVar28,pcVar19);
                    }
                  }
LAB_001e7ad6:
                  pcVar19 = "split pyr";
                  uVar15 = 0x880;
                  goto LAB_001e3971;
                }
                pcVar19 = "temp ref_cell free";
                uVar15 = 0x641;
              }
              else {
                pcVar19 = "temp cell";
                uVar15 = 0x588;
              }
LAB_001e6207:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,uVar15,"ref_subdiv_split_pri",uVar28,pcVar19);
            }
          }
          pcVar19 = "split pri";
          uVar15 = 0x87e;
          goto LAB_001e3971;
        }
        pcVar19 = "temp ref_cell free";
        uVar15 = 0x706;
      }
      else {
        uVar28 = (ulong)uVar7;
        pcVar19 = "temp cell";
        uVar15 = 0x672;
      }
LAB_001e4ede:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar15,"ref_subdiv_split_tet",uVar28,pcVar19);
    }
  }
  pcVar19 = "split tet";
  uVar15 = 0x87d;
LAB_001e3971:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar15,
         "ref_subdiv_split",uVar28,pcVar19);
  return (REF_STATUS)uVar28;
LAB_001e89b1:
  iVar20 = iVar20 + 1;
  goto LAB_001e897f;
LAB_001eace6:
  for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1) {
    if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
      uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
      if (uVar7 != 0) {
        pcVar19 = "remove";
        uVar15 = 0x536;
        goto LAB_001eb889;
      }
      uVar28 = (ulong)(uint)pRVar1->max;
    }
  }
  for (iVar20 = 0; iVar20 < ref_cell_split->max; iVar20 = iVar20 + 1) {
    RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
    if ((RVar10 == 0) && (uVar7 = ref_subdiv_add_local_cell(ref_subdiv,pRVar1,nodes), uVar7 != 0)) {
      uVar15 = 0x539;
      goto LAB_001eb84c;
    }
  }
  iVar20 = 0;
LAB_001eb79d:
  if (iVar20 < ((REF_CELL)CONCAT44(uStack_24c,e0))->max) {
    RVar10 = ref_cell_nodes((REF_CELL)CONCAT44(uStack_24c,e0),iVar20,nodes);
    if ((RVar10 != 0) ||
       (uVar7 = ref_subdiv_add_local_cell(ref_subdiv,(REF_CELL)local_240,nodes), uVar7 == 0))
    goto LAB_001eb7cb;
    uVar15 = 0x53c;
LAB_001eb84c:
    uVar28 = (ulong)uVar7;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar15
           ,"ref_subdiv_split_tri",uVar28,"add local");
    goto LAB_001eb896;
  }
  uVar7 = ref_cell_free(ref_cell_split);
  if (uVar7 == 0) {
    uVar7 = ref_cell_free((REF_CELL)CONCAT44(uStack_24c,e0));
    if (uVar7 == 0) {
      free(pvVar11);
      pRVar1 = ref_subdiv->grid->cell[0];
      lVar14 = (long)pRVar1->max;
      if (lVar14 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x553,"ref_subdiv_split_edg","malloc marked_for_removal of REF_INT negative");
        uVar28 = 1;
      }
      else {
        pvVar11 = malloc(lVar14 * 4);
        if (pvVar11 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x553,"ref_subdiv_split_edg","malloc marked_for_removal of REF_INT NULL");
          uVar28 = 2;
        }
        else {
          for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
            *(undefined4 *)((long)pvVar11 + lVar12 * 4) = 0;
          }
          uVar7 = ref_cell_create(&ref_cell_split,pRVar1->type);
          if (uVar7 == 0) {
            lVar14 = 0;
            while( true ) {
              uVar28 = (ulong)pRVar1->max;
              iVar20 = (int)lVar14;
              if ((long)uVar28 <= lVar14) break;
              if (pRVar1->c2n[(long)iVar20 * (long)pRVar1->size_per] != -1) {
                uVar7 = ref_cell_nodes(pRVar1,iVar20,nodes);
                if (uVar7 == 0) {
                  uVar7 = ref_edge_with(ref_subdiv->edge,nodes[0],nodes[1],&e1);
                  if (uVar7 == 0) {
                    if (ref_subdiv->mark[e1] == 0) goto LAB_001ebad5;
                    *(undefined4 *)((long)pvVar11 + lVar14 * 4) = 1;
                    uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                    if (uVar7 == 0) {
                      uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
                      if (uVar7 == 0) {
                        uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                        if (uVar7 == 0) {
                          uVar7 = ref_cell_nodes(pRVar1,iVar20,new_nodes);
                          if (uVar7 == 0) {
                            uVar7 = ref_subdiv_node_between
                                              (ref_subdiv,nodes[0],nodes[1],new_nodes + 1);
                            if (uVar7 == 0) {
                              uVar7 = ref_cell_add(ref_cell_split,new_nodes,&e0);
                              if (uVar7 == 0) goto LAB_001ebad5;
                              pcVar19 = "add";
                              uVar15 = 0x567;
                            }
                            else {
                              pcVar19 = "mis";
                              uVar15 = 0x566;
                            }
                          }
                          else {
                            pcVar19 = "nodes";
                            uVar15 = 0x563;
                          }
                        }
                        else {
                          pcVar19 = "add";
                          uVar15 = 0x562;
                        }
                      }
                      else {
                        pcVar19 = "mis";
                        uVar15 = 0x561;
                      }
                    }
                    else {
                      pcVar19 = "nodes";
                      uVar15 = 0x55e;
                    }
                  }
                  else {
                    pcVar19 = "e01";
                    uVar15 = 0x55a;
                  }
                }
                else {
                  pcVar19 = "nodes";
                  uVar15 = 0x558;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,uVar15,"ref_subdiv_split_edg",(ulong)uVar7,pcVar19);
                uVar28 = (ulong)uVar7;
                goto LAB_001ebd2b;
              }
LAB_001ebad5:
              lVar14 = lVar14 + 1;
            }
            for (lVar14 = 0; lVar14 < (int)uVar28; lVar14 = lVar14 + 1) {
              if (*(int *)((long)pvVar11 + lVar14 * 4) == 1) {
                uVar7 = ref_cell_remove(pRVar1,(REF_INT)lVar14);
                if (uVar7 != 0) {
                  pcVar19 = "remove";
                  uVar15 = 0x56d;
                  goto LAB_001ebceb;
                }
                uVar28 = (ulong)(uint)pRVar1->max;
              }
            }
            for (iVar20 = 0; iVar20 < ref_cell_split->max; iVar20 = iVar20 + 1) {
              RVar10 = ref_cell_nodes(ref_cell_split,iVar20,nodes);
              if ((RVar10 == 0) &&
                 (uVar7 = ref_subdiv_add_local_cell(ref_subdiv,pRVar1,nodes), uVar7 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x570,"ref_subdiv_split_edg",(ulong)uVar7,"add local");
                uVar28 = (ulong)uVar7;
                goto LAB_001ebd2b;
              }
            }
            uVar7 = ref_cell_free(ref_cell_split);
            if (uVar7 == 0) {
              free(pvVar11);
              lVar14 = 0;
              do {
                if (local_d0->max <= lVar14) {
                  return 0;
                }
                if ((((-1 < local_d0->global[lVar14]) &&
                     ((pRVar2 = local_138->cell[8]->ref_adj, pRVar2->nnode <= lVar14 ||
                      (pRVar2->first[lVar14] == -1)))) &&
                    ((pRVar2 = local_138->cell[9]->ref_adj, pRVar2->nnode <= lVar14 ||
                     (pRVar2->first[lVar14] == -1)))) &&
                   (((pRVar2 = local_138->cell[10]->ref_adj, pRVar2->nnode <= lVar14 ||
                     (pRVar2->first[lVar14] == -1)) &&
                    ((pRVar2 = local_138->cell[0xb]->ref_adj, pRVar2->nnode <= lVar14 ||
                     (pRVar2->first[lVar14] == -1)))))) {
                  if (ref_subdiv->grid->mpi->id == local_d0->part[lVar14]) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x890,"ref_subdiv_split",1,"unused local node");
                    return 1;
                  }
                  pRVar2 = local_138->cell[3]->ref_adj;
                  if (((lVar14 < pRVar2->nnode) && (pRVar2->first[lVar14] != -1)) ||
                     ((pRVar2 = local_138->cell[6]->ref_adj, lVar14 < pRVar2->nnode &&
                      (pRVar2->first[lVar14] != -1)))) {
                    pcVar19 = "boundary face node not in vol cells";
                    uVar28 = 1;
                    uVar15 = 0x894;
                    goto LAB_001e3971;
                  }
                  uVar7 = ref_node_remove_without_global(local_d0,(REF_INT)lVar14);
                  if (uVar7 != 0) {
                    uVar15 = 0x896;
LAB_001ebf81:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,uVar15,"ref_subdiv_split",(ulong)uVar7,"rm");
                    return uVar7;
                  }
                  uVar7 = ref_geom_remove_all(local_138->geom,(REF_INT)lVar14);
                  if (uVar7 != 0) {
                    uVar15 = 0x897;
                    goto LAB_001ebf81;
                  }
                }
                lVar14 = lVar14 + 1;
              } while( true );
            }
            pcVar19 = "temp edg free";
            uVar15 = 0x572;
          }
          else {
            pcVar19 = "temp edg";
            uVar15 = 0x555;
          }
LAB_001ebceb:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 uVar15,"ref_subdiv_split_edg",(ulong)uVar7,pcVar19);
          uVar28 = (ulong)uVar7;
        }
      }
LAB_001ebd2b:
      pcVar19 = "split edg";
      uVar15 = 0x886;
      goto LAB_001e3971;
    }
    pcVar19 = "temp qua free";
    uVar15 = 0x53f;
  }
  else {
    pcVar19 = "temp tri free";
    uVar15 = 0x53e;
  }
LAB_001eb889:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar15,
         "ref_subdiv_split_tri",(ulong)uVar7,pcVar19);
  uVar28 = (ulong)uVar7;
LAB_001eb896:
  pcVar19 = "split tri";
  uVar15 = 0x884;
  goto LAB_001e3971;
LAB_001eb7cb:
  iVar20 = iVar20 + 1;
  goto LAB_001eb79d;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT node;
  REF_INT nmark;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob for mark relax");

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked before relaxation\n", nmark);
  }

  if (ref_subdiv->allow_geometry) {
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
      RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    }
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
    RSS(ref_subdiv_unmark_neg_tet_relax(ref_subdiv), "geom neg marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  } else {
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
    }
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    RSS(ref_subdiv_unmark_relax(ref_subdiv), "relax marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  }

  RSS(ref_subdiv_split_tet(ref_subdiv), "split tet");
  RSS(ref_subdiv_split_pri(ref_subdiv), "split pri");
  /* pyr comes last, it can make other elements too */
  RSS(ref_subdiv_split_pyr(ref_subdiv), "split pyr");

  RSS(ref_subdiv_split_qua(ref_subdiv), "split qua");
  /* tri comes last, it can make qua elements too */
  RSS(ref_subdiv_split_tri(ref_subdiv), "split tri");

  RSS(ref_subdiv_split_edg(ref_subdiv), "split edg");

  /* remove unused nodes on partition boundaries */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      if (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
          ref_node_part(ref_node, node)) {
        RSS(REF_FAILURE, "unused local node");
      }
      if (!ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) ||
          !ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node)) {
        RSS(REF_FAILURE, "boundary face node not in vol cells");
      }
      RSS(ref_node_remove_without_global(ref_node, node), "rm");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm");
    }
  }

  return REF_SUCCESS;
}